

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *p,Ivy_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  int iVar1;
  lit *begin;
  void *pvVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x987,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  if ((*(uint *)&pNode->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x988,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  lVar3 = (long)vSuper->nSize;
  begin = (lit *)malloc(lVar3 * 4 + 4);
  iVar4 = 0;
  while (iVar1 = vSuper->nSize, iVar4 < iVar1) {
    pvVar2 = Vec_PtrEntry(vSuper,iVar4);
    *begin = ((uint)pvVar2 & 1) + *(int *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x28) * 2;
    begin[1] = *(int *)&pNode->pNextFan0 * 2 + 1;
    iVar1 = sat_solver_addclause(p->pSat,begin,begin + 2);
    iVar4 = iVar4 + 1;
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x993,
                    "void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
    }
  }
  for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
    pvVar2 = Vec_PtrEntry(vSuper,(int)lVar5);
    begin[lVar5] = ((uint)pvVar2 & 1) + *(int *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x28) * 2 ^
                   1;
    iVar1 = vSuper->nSize;
  }
  begin[lVar3] = *(int *)&pNode->pNextFan0 * 2;
  iVar4 = sat_solver_addclause(p->pSat,begin,begin + lVar3 + 1);
  if (iVar4 != 0) {
    free(begin);
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x99a,"void Ivy_FraigAddClausesSuper(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Ivy_FraigAddClausesSuper( Ivy_FraigMan_t * p, Ivy_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Ivy_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Ivy_IsComplement(pNode) );
    assert( Ivy_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Ivy_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Ivy_ObjSatNum(Ivy_Regular(pFanin)), Ivy_IsComplement(pFanin));
        pLits[1] = toLitCond(Ivy_ObjSatNum(pNode), 1);
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Ivy_Obj_t *, vSuper, pFanin, i )
        pLits[i] = toLitCond(Ivy_ObjSatNum(Ivy_Regular(pFanin)), !Ivy_IsComplement(pFanin));
    pLits[nLits-1] = toLitCond(Ivy_ObjSatNum(pNode), 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}